

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadExtend
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  Literal *pLVar5;
  Literal *this_00;
  array<wasm::Literal,_8UL> local_348;
  array<wasm::Literal,_4UL> local_288;
  undefined1 auStack_228 [8];
  array<wasm::Literal,_2UL> lanes;
  Address local_160;
  Address memorySize;
  Literal local_140;
  undefined1 local_128 [8];
  MemoryInstanceInfo info;
  Literal local_f8;
  Literal local_e0;
  MemoryInstanceInfo *local_c8;
  anon_class_16_2_3ef7c955 loadLane;
  anon_class_40_5_49a3c194 fillLanes;
  Flow flow;
  Address src;
  SIMDLoad *curr_local;
  
  src.addr = (address64_t)curr;
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&fillLanes.memorySize,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x28));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)fillLanes.memorySize != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    if (flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
        super_IString.str._M_str != (char *)0x2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    flow.breakTo.super_IString.str._M_str =
         (char *)(ulong)(uint)flow.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_128,this,(Name)((IString *)(src.addr + 0x30))->str);
    local_c8 = (MemoryInstanceInfo *)&src;
    loadLane.curr = (SIMDLoad **)local_128;
    local_160 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_128,(Name)info._0_16_);
    fillLanes.src = &local_160;
    loadLane.info = (MemoryInstanceInfo *)&stack0xffffffffffffff38;
    fillLanes.curr = (SIMDLoad **)&flow.breakTo.super_IString.str._M_str;
    uVar1 = *(uint *)(src.addr + 0x10);
    fillLanes.loadLane = (anon_class_16_2_3ef7c955 *)local_128;
    fillLanes.info = (MemoryInstanceInfo *)&src;
    if (9 < uVar1) {
LAB_00136e0e:
      wasm::handle_unreachable
                ("unexpected op",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                 ,0xcdb);
    }
    if ((0x30U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x300U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00136e0e;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_228 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        bVar3 = false;
        pLVar5 = (Literal *)auStack_228;
        this_00 = (Literal *)&memorySize;
        do {
          wasm::Literal::Literal(this_00,pLVar5);
          bVar2 = !bVar3;
          bVar3 = true;
          pLVar5 = (Literal *)&lanes._M_elems[0].type;
          this_00 = &local_140;
        } while (bVar2);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_e0,&loadLane.info,(array<wasm::Literal,_2UL> *)&memorySize,4);
        Flow::Flow(__return_storage_ptr__,&local_e0);
        wasm::Literal::~Literal(&local_e0);
        lVar4 = 0x18;
        do {
          wasm::Literal::~Literal((Literal *)((long)&memorySize.addr + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        lVar4 = 0x18;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
      else {
        lanes._M_elems[1].type.id = 0;
        lanes._M_elems[1].field_0.i64 = 0;
        lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
        lanes._M_elems[0].type.id = 0;
        auStack_228 = (undefined1  [8])0x0;
        lanes._M_elems[0].field_0.i64 = 0;
        lVar4 = 0;
        do {
          wasm::Literal::Literal
                    ((Literal *)((long)&local_288._M_elems[0].field_0 + lVar4),
                     (Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x60);
        visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                  (&local_f8,&loadLane.info,&local_288,2);
        Flow::Flow(__return_storage_ptr__,&local_f8);
        wasm::Literal::~Literal(&local_f8);
        lVar4 = 0x48;
        do {
          wasm::Literal::~Literal((Literal *)((long)&local_288._M_elems[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        lVar4 = 0x48;
        do {
          wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
    }
    else {
      lVar4 = 0;
      memset(auStack_228,0,0xc0);
      do {
        wasm::Literal::Literal
                  ((Literal *)((long)&local_348._M_elems[0].field_0 + lVar4),
                   (Literal *)((long)lanes._M_elems + lVar4 + -8));
        lVar4 = lVar4 + 0x18;
      } while (lVar4 != 0xc0);
      visitSIMDLoadExtend(wasm::SIMDLoad*)::{lambda(auto:1,unsigned_long)#1}::operator()
                ((Literal *)&info.name.super_IString.str._M_str,&loadLane.info,&local_348,1);
      Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
      wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      lVar4 = 0xa8;
      do {
        wasm::Literal::~Literal((Literal *)((long)&local_348._M_elems[0].field_0 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      lVar4 = 0xa8;
      do {
        wasm::Literal::~Literal((Literal *)((long)lanes._M_elems + lVar4 + -8));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
    }
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)fillLanes.memorySize;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadExtend(SIMDLoad* curr) {
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    Address src(uint32_t(flow.getSingleValue().geti32()));
    auto info = getMemoryInstanceInfo(curr->memory);
    auto loadLane = [&](Address addr) {
      switch (curr->op) {
        case Load8x8SVec128:
          return Literal(
            int32_t(info.instance->externalInterface->load8s(addr, info.name)));
        case Load8x8UVec128:
          return Literal(
            int32_t(info.instance->externalInterface->load8u(addr, info.name)));
        case Load16x4SVec128:
          return Literal(int32_t(
            info.instance->externalInterface->load16s(addr, info.name)));
        case Load16x4UVec128:
          return Literal(int32_t(
            info.instance->externalInterface->load16u(addr, info.name)));
        case Load32x2SVec128:
          return Literal(int64_t(
            info.instance->externalInterface->load32s(addr, info.name)));
        case Load32x2UVec128:
          return Literal(int64_t(
            info.instance->externalInterface->load32u(addr, info.name)));
        default:
          WASM_UNREACHABLE("unexpected op");
      }
      WASM_UNREACHABLE("invalid op");
    };
    auto memorySize = info.instance->getMemorySize(info.name);
    auto fillLanes = [&](auto lanes, size_t laneBytes) {
      for (auto& lane : lanes) {
        lane = loadLane(info.instance->getFinalAddress(
          curr, Literal(uint32_t(src)), laneBytes, memorySize));
        src = Address(uint32_t(src) + laneBytes);
      }
      return Literal(lanes);
    };
    switch (curr->op) {
      case Load8x8SVec128:
      case Load8x8UVec128: {
        std::array<Literal, 8> lanes;
        return fillLanes(lanes, 1);
      }
      case Load16x4SVec128:
      case Load16x4UVec128: {
        std::array<Literal, 4> lanes;
        return fillLanes(lanes, 2);
      }
      case Load32x2SVec128:
      case Load32x2UVec128: {
        std::array<Literal, 2> lanes;
        return fillLanes(lanes, 4);
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    WASM_UNREACHABLE("invalid op");
  }